

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbmmap.c
# Opt level: O0

gbspace_t get_space(uint address)

{
  uint address_local;
  undefined4 local_4;
  
  if (address < 0x4000) {
    local_4 = rom_0;
  }
  else if (address < 0x8000) {
    local_4 = rom_n;
  }
  else if (address < 0xa000) {
    local_4 = vram;
  }
  else if (address < 0xc000) {
    local_4 = ram;
  }
  else if (address < 0xd000) {
    local_4 = wram_0;
  }
  else if (address < 0xe000) {
    local_4 = wram_n;
  }
  else if (address < 0xfe00) {
    local_4 = echo;
  }
  else if (address < 0xfea0) {
    local_4 = oam;
  }
  else if (address < 0xff00) {
    local_4 = unusable;
  }
  else if (address < 0xff80) {
    local_4 = io;
  }
  else if (address < 0xffff) {
    local_4 = hram;
  }
  else if (address == 0xffff) {
    local_4 = ie;
  }
  else {
    local_4 = out_of_mmap;
  }
  return local_4;
}

Assistant:

gbspace_t get_space(unsigned address)
{
    if (address < 0x4000)
        return rom_0;
    if (address < 0x8000)
        return rom_n;
    if (address < 0xA000)
        return vram;
    if (address < 0xC000)
        return ram;
    if (address < 0xD000)
        return wram_0;
    if (address < 0xE000)
        return wram_n;
    if (address < 0xFE00)
        return echo;
    if (address < 0xFEA0)
        return oam;
    if (address < 0xFF00)
        return unusable;
    if (address < 0xFF80)
        return io;
    if (address < 0xFFFF)
        return hram;
    if (address == 0xFFFF)
        return ie;

    return out_of_mmap;
}